

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,string *input)

{
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> *__x;
  cmCompiledGeneratorExpression *this_00;
  string *in_RDX;
  cmCompiledGeneratorExpression *x;
  cmListFileBacktrace local_78;
  Snapshot local_40;
  auto_ptr<cmCompiledGeneratorExpression> local_28;
  
  this_00 = (cmCompiledGeneratorExpression *)operator_new(400);
  __x = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)(input->_M_dataplus)._M_p;
  if (__x == (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)0x0) {
    cmState::Snapshot::Snapshot(&local_40,(cmState *)0x0,(PositionType)ZEXT816(0));
    local_78.Snapshot.Position.Position = local_40.Position.Position;
    local_78.Snapshot.State = local_40.State;
    local_78.Snapshot.Position.Tree = local_40.Position.Tree;
    local_78.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
              (&local_78.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>,__x);
    local_78.Snapshot.Position.Position =
         (PositionType)
         __x[1].super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.Snapshot.State =
         (cmState *)
         __x[1].super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.Snapshot.Position.Tree =
         (cmLinkedTree<cmState::SnapshotDataType> *)
         __x[1].super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  cmCompiledGeneratorExpression::cmCompiledGeneratorExpression(this_00,&local_78,in_RDX);
  local_28.x_ = (cmCompiledGeneratorExpression *)0x0;
  this->Backtrace = (cmListFileBacktrace *)this_00;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_28);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_78.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

cmsys::auto_ptr<cmCompiledGeneratorExpression>
cmGeneratorExpression::Parse(std::string const& input)
{
  return cmsys::auto_ptr<cmCompiledGeneratorExpression>(
    new cmCompiledGeneratorExpression(
      this->Backtrace ? *this->Backtrace : cmListFileBacktrace(),
      input));
}